

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O1

void __thiscall
google::
sparse_hashtable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>
::clear(sparse_hashtable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>
        *this)

{
  ulong uVar1;
  pointer this_00;
  float fVar2;
  float fVar3;
  
  if (this->num_deleted != 0 || (this->table).settings.num_buckets != 0) {
    for (this_00 = (this->table).groups.
                   super__Vector_base<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        this_00 !=
        (this->table).groups.
        super__Vector_base<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
      sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>
      ::free_group(this_00);
      this_00->settings = 0;
      this_00->bitmap[0] = '\0';
      this_00->bitmap[1] = '\0';
      this_00->bitmap[2] = '\0';
      this_00->bitmap[3] = '\0';
      this_00->bitmap[4] = '\0';
      this_00->bitmap[5] = '\0';
    }
    (this->table).settings.num_buckets = 0;
  }
  fVar2 = (float)(this->table).settings.table_size;
  fVar3 = (this->settings).
          super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
          .enlarge_factor_ * fVar2;
  uVar1 = (ulong)fVar3;
  (this->settings).
  super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
  .enlarge_threshold_ = (long)(fVar3 - 9.223372e+18) & (long)uVar1 >> 0x3f | uVar1;
  fVar2 = fVar2 * (this->settings).
                  super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
                  .shrink_factor_;
  uVar1 = (ulong)fVar2;
  (this->settings).
  super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
  .shrink_threshold_ = (long)(fVar2 - 9.223372e+18) & (long)uVar1 >> 0x3f | uVar1;
  (this->settings).
  super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
  .consider_shrink_ = false;
  this->num_deleted = 0;
  return;
}

Assistant:

void clear() {
    if (!empty() || (num_deleted != 0)) {
      table.clear();
    }
    settings.reset_thresholds(bucket_count());
    num_deleted = 0;
  }